

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O3

void __thiscall
slang::analysis::DataFlowAnalysis::noteReference
          (DataFlowAnalysis *this,ValueSymbol *symbol,Expression *lsp)

{
  undefined1 *puVar1;
  char *pcVar2;
  uint *other;
  undefined4 uVar3;
  int iVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  Type *rootType;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  pair<const_slang::ast::ValueSymbol_*const,_unsigned_int> *ppVar16;
  ulong uVar17;
  SymbolLSPMap *this_00;
  char cVar18;
  char cVar19;
  char cVar20;
  byte bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  try_emplace_args_t local_185;
  uint local_184;
  Expression *local_180;
  optional<std::pair<unsigned_long,_unsigned_long>_> bounds;
  locator res;
  undefined1 local_128 [32];
  unsigned_long local_108;
  unsigned_long uStack_100;
  overlap_iterator local_f8;
  char local_a8;
  char cStack_a7;
  char cStack_a6;
  byte bStack_a5;
  char cStack_a4;
  char cStack_a3;
  char cStack_a2;
  byte bStack_a1;
  char cStack_a0;
  char cStack_9f;
  char cStack_9e;
  byte bStack_9d;
  char cStack_9c;
  char cStack_9b;
  char cStack_9a;
  byte bStack_99;
  char local_98;
  char cStack_97;
  char cStack_96;
  byte bStack_95;
  char cStack_94;
  char cStack_93;
  char cStack_92;
  byte bStack_91;
  char cStack_90;
  char cStack_8f;
  char cStack_8e;
  byte bStack_8d;
  char cStack_8c;
  char cStack_8b;
  char cStack_8a;
  byte bStack_89;
  iterator local_80;
  unsigned_long local_40;
  unsigned_long uStack_38;
  
  if ((this->
      super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>)
      .state.reachable == true) {
    rootType = ast::DeclaredType::getType(&symbol->declaredType);
    ast::ValueDriver::getBounds
              (&bounds,lsp,
               &(this->
                super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                ).super_FlowAnalysisBase.evalContext,rootType);
    if (bounds.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>._M_payload.
        super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>._M_engaged == true) {
      local_f8.super_iterator.super_const_iterator.map =
           (IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *)symbol;
      if (this->isLValue == true) {
        puVar1 = &(this->symbolToSlot).super_Storage.field_0x48;
        local_184 = (uint)(this->lvalues).
                          super_SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>.len
        ;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = symbol;
        uVar14 = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar9 = uVar14 >> ((this->symbolToSlot).field_0x50 & 0x3f);
        uVar3 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar14 & 0xff];
        uVar17 = *(ulong *)&(this->symbolToSlot).field_0x58;
        uVar15 = 0;
        uVar12 = uVar9;
        do {
          pcVar2 = (char *)(*(long *)&(this->symbolToSlot).field_0x60 + uVar12 * 0x10);
          local_a8 = *pcVar2;
          cStack_a7 = pcVar2[1];
          cStack_a6 = pcVar2[2];
          bStack_a5 = pcVar2[3];
          cStack_a4 = pcVar2[4];
          cStack_a3 = pcVar2[5];
          cStack_a2 = pcVar2[6];
          bStack_a1 = pcVar2[7];
          cStack_a0 = pcVar2[8];
          cStack_9f = pcVar2[9];
          cStack_9e = pcVar2[10];
          bStack_9d = pcVar2[0xb];
          cStack_9c = pcVar2[0xc];
          cStack_9b = pcVar2[0xd];
          cStack_9a = pcVar2[0xe];
          bStack_99 = pcVar2[0xf];
          cVar18 = (char)uVar3;
          auVar22[0] = -(local_a8 == cVar18);
          cVar19 = (char)((uint)uVar3 >> 8);
          auVar22[1] = -(cStack_a7 == cVar19);
          cVar20 = (char)((uint)uVar3 >> 0x10);
          auVar22[2] = -(cStack_a6 == cVar20);
          bVar21 = (byte)((uint)uVar3 >> 0x18);
          auVar22[3] = -(bStack_a5 == bVar21);
          auVar22[4] = -(cStack_a4 == cVar18);
          auVar22[5] = -(cStack_a3 == cVar19);
          auVar22[6] = -(cStack_a2 == cVar20);
          auVar22[7] = -(bStack_a1 == bVar21);
          auVar22[8] = -(cStack_a0 == cVar18);
          auVar22[9] = -(cStack_9f == cVar19);
          auVar22[10] = -(cStack_9e == cVar20);
          auVar22[0xb] = -(bStack_9d == bVar21);
          auVar22[0xc] = -(cStack_9c == cVar18);
          auVar22[0xd] = -(cStack_9b == cVar19);
          auVar22[0xe] = -(cStack_9a == cVar20);
          auVar22[0xf] = -(bStack_99 == bVar21);
          uVar13 = (uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe);
          local_180 = lsp;
          if (uVar13 != 0) {
            lVar11 = *(long *)&(this->symbolToSlot).field_0x68 + uVar12 * 0xf0;
            do {
              iVar4 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
                }
              }
              if (*(ValueSymbol **)(lVar11 + (ulong)(uint)(iVar4 << 4)) == symbol) {
                ppVar16 = (pair<const_slang::ast::ValueSymbol_*const,_unsigned_int> *)
                          (lVar11 + (ulong)(uint)(iVar4 << 4));
                goto LAB_004090f8;
              }
              uVar13 = uVar13 - 1 & uVar13;
            } while (uVar13 != 0);
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar14 & 7] & bStack_99) == 0)
          break;
          lVar11 = uVar12 + uVar15;
          uVar15 = uVar15 + 1;
          uVar12 = lVar11 + 1U & uVar17;
        } while (uVar15 <= uVar17);
        if (*(ulong *)&(this->symbolToSlot).field_0x78 < *(ulong *)&(this->symbolToSlot).field_0x70)
        {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,unsigned_int>,64ul,16ul>>
          ::
          nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::ValueSymbol_const*,unsigned_int>
                    (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,unsigned_int>,64ul,16ul>>
                           *)puVar1,(arrays_type *)&(this->symbolToSlot).field_0x50,uVar9,uVar14,
                     &local_185,(ValueSymbol **)&local_f8,&local_184);
          puVar1 = &(this->symbolToSlot).field_0x78;
          *(long *)puVar1 = *(long *)puVar1 + 1;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,unsigned_int>,64ul,16ul>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::ValueSymbol_const*,unsigned_int>
                    (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,unsigned_int>,64ul,16ul>>
                           *)puVar1,uVar14,&local_185,(ValueSymbol **)&local_f8,&local_184);
        }
        ppVar16 = res.p;
        SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>::
        emplace_back<slang::ast::ValueSymbol_const&>
                  (&(this->lvalues).
                    super_SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>,symbol);
LAB_004090f8:
        uVar17 = (ulong)ppVar16->second;
        if ((this->
            super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
            ).state.assigned.
            super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.len <=
            uVar17) {
          SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>>::
          resizeImpl<slang::SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>>::ValueInitTag>
                    ((SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>> *)
                     &(this->
                      super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                      ).state,(ulong)(ppVar16->second + 1),(ValueInitTag *)&res);
        }
        IntervalMap<unsigned_long,_std::monostate,_3U>::unionWith
                  ((this->
                   super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                   ).state.assigned.
                   super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                   data_ + uVar17,
                   bounds.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                   _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>
                   ._M_payload._M_value.first,
                   bounds.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                   _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>
                   ._M_payload._M_value.second,(monostate *)&res,&this->bitMapAllocator);
        this_00 = &(this->lvalues).
                   super_SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>.data_
                   [uVar17].assigned;
        IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::find
                  ((overlap_iterator *)&res,this_00,
                   bounds.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                   _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>
                   ._M_payload._M_value.first,
                   bounds.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                   _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>
                   ._M_payload._M_value.second);
        other = &res.n;
        do {
          while( true ) {
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::end
                      (&local_f8.super_iterator,this_00);
            bVar8 = IntervalMapDetails::Path::operator==
                              ((Path *)other,&local_f8.super_iterator.super_const_iterator.path);
            if (local_f8.super_iterator.super_const_iterator.path.path.
                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
                (pointer)((long)&local_f8.super_iterator.super_const_iterator.path.path.
                                 super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry> +
                         0x18U)) {
              operator_delete(local_f8.super_iterator.super_const_iterator.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
            }
            if (bVar8) {
              if ((undefined1 *)res._8_8_ != local_128) {
                operator_delete((void *)res._8_8_);
              }
              res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)local_180;
              IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::insert
                        (this_00,bounds.
                                 super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>
                                 ._M_payload._M_value.first,
                         bounds.
                         super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                         _M_payload.
                         super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>.
                         _M_payload._M_value.second,(Expression **)&res,&this->lspMapAllocator);
              return;
            }
            lVar11 = *(long *)(res._8_8_ + -0x10 + (long)res.p * 0x10);
            lVar10 = (ulong)*(uint *)(res._8_8_ + -4 + (long)res.p * 0x10) * 0x10;
            uVar17 = *(ulong *)(lVar11 + 8 + lVar10);
            if (*(ulong *)(lVar11 + lVar10) <=
                bounds.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>.
                _M_payload._M_value.first) break;
            if (bounds.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>.
                _M_payload._M_value.second <= uVar17) goto LAB_004092d8;
            local_80.super_const_iterator.map =
                 (IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *)res.pg;
            SmallVector<slang::IntervalMapDetails::Path::Entry,_2UL>::SmallVector
                      (&local_80.super_const_iterator.path.path,(Base *)other);
            local_40 = local_108;
            uStack_38 = uStack_100;
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::iterator::erase
                      (&local_80,&this->lspMapAllocator,true);
            if (local_80.super_const_iterator.path.path.
                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
                (pointer)local_80.super_const_iterator.path.path.
                         super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.firstElement)
            {
              operator_delete(local_80.super_const_iterator.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
            }
            IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::find
                      (&local_f8,this_00,
                       bounds.
                       super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                       _M_payload.
                       super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>.
                       _M_payload._M_value.first,
                       bounds.
                       super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                       _M_payload.
                       super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>.
                       _M_payload._M_value.second);
            res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)
                     local_f8.super_iterator.super_const_iterator.map;
            SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator=
                      ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)other,
                       (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)
                       &local_f8.super_iterator.super_const_iterator.path);
            local_108 = local_f8.searchKey.left;
            uStack_100 = local_f8.searchKey.right;
            if (local_f8.super_iterator.super_const_iterator.path.path.
                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
                (pointer)((long)&local_f8.super_iterator.super_const_iterator.path.path.
                                 super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry> +
                         0x18U)) {
              operator_delete(local_f8.super_iterator.super_const_iterator.path.path.
                              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
            }
          }
          if (bounds.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
              _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>.
              _M_payload._M_value.second <= uVar17) {
            if ((undefined1 *)res._8_8_ == local_128) {
              return;
            }
            operator_delete((void *)res._8_8_);
            return;
          }
LAB_004092d8:
          IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::overlap_iterator::
          operator++((overlap_iterator *)&res);
        } while( true );
      }
      local_180 = (Expression *)&(this->rvalues).super_Storage.field_0x128;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = symbol;
      uVar14 = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar9 = uVar14 >> ((this->rvalues).field_0x130 & 0x3f);
      uVar3 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[uVar14 & 0xff];
      uVar17 = *(ulong *)&(this->rvalues).field_0x138;
      uVar15 = 0;
      uVar12 = uVar9;
      do {
        pcVar2 = (char *)(*(long *)&(this->rvalues).field_0x140 + uVar12 * 0x10);
        local_98 = *pcVar2;
        cStack_97 = pcVar2[1];
        cStack_96 = pcVar2[2];
        bStack_95 = pcVar2[3];
        cStack_94 = pcVar2[4];
        cStack_93 = pcVar2[5];
        cStack_92 = pcVar2[6];
        bStack_91 = pcVar2[7];
        cStack_90 = pcVar2[8];
        cStack_8f = pcVar2[9];
        cStack_8e = pcVar2[10];
        bStack_8d = pcVar2[0xb];
        cStack_8c = pcVar2[0xc];
        cStack_8b = pcVar2[0xd];
        cStack_8a = pcVar2[0xe];
        bStack_89 = pcVar2[0xf];
        cVar18 = (char)uVar3;
        auVar23[0] = -(local_98 == cVar18);
        cVar19 = (char)((uint)uVar3 >> 8);
        auVar23[1] = -(cStack_97 == cVar19);
        cVar20 = (char)((uint)uVar3 >> 0x10);
        auVar23[2] = -(cStack_96 == cVar20);
        bVar21 = (byte)((uint)uVar3 >> 0x18);
        auVar23[3] = -(bStack_95 == bVar21);
        auVar23[4] = -(cStack_94 == cVar18);
        auVar23[5] = -(cStack_93 == cVar19);
        auVar23[6] = -(cStack_92 == cVar20);
        auVar23[7] = -(bStack_91 == bVar21);
        auVar23[8] = -(cStack_90 == cVar18);
        auVar23[9] = -(cStack_8f == cVar19);
        auVar23[10] = -(cStack_8e == cVar20);
        auVar23[0xb] = -(bStack_8d == bVar21);
        auVar23[0xc] = -(cStack_8c == cVar18);
        auVar23[0xd] = -(cStack_8b == cVar19);
        auVar23[0xe] = -(cStack_8a == cVar20);
        auVar23[0xf] = -(bStack_89 == bVar21);
        uVar13 = (uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe);
        if (uVar13 != 0) {
          lVar11 = *(long *)&(this->rvalues).field_0x148 + uVar12 * 0x438;
          do {
            uVar5 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
              }
            }
            if (*(ValueSymbol **)(lVar11 + (ulong)uVar5 * 0x48) == symbol) {
              res.p = (pair<const_slang::ast::ValueSymbol_*const,_unsigned_int> *)
                      ((ulong)uVar5 * 0x48 + lVar11);
              goto LAB_00409325;
            }
            uVar13 = uVar13 - 1 & uVar13;
          } while (uVar13 != 0);
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar14 & 7] & bStack_89) == 0)
        break;
        lVar11 = uVar12 + uVar15;
        uVar15 = uVar15 + 1;
        uVar12 = lVar11 + 1U & uVar17;
      } while (uVar15 <= uVar17);
      if (*(ulong *)&(this->rvalues).field_0x158 < *(ulong *)&(this->rvalues).field_0x150) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
        ::
        nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::ValueSymbol_const*>
                  ((locator *)&res,
                   (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
                    *)local_180,(arrays_type *)&(this->rvalues).field_0x130,uVar9,uVar14,
                   (try_emplace_args_t *)&local_184,(ValueSymbol **)&local_f8);
        puVar1 = &(this->rvalues).field_0x158;
        *(long *)puVar1 = *(long *)puVar1 + 1;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::ValueSymbol_const*>
                  ((locator *)&res,
                   (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
                    *)local_180,uVar14,(try_emplace_args_t *)&local_184,(ValueSymbol **)&local_f8);
      }
LAB_00409325:
      IntervalMap<unsigned_long,_std::monostate,_3U>::unionWith
                ((IntervalMap<unsigned_long,_std::monostate,_3U> *)&(res.p)->second,
                 bounds.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                 _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>.
                 _M_payload._M_value.first,
                 bounds.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                 _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>.
                 _M_payload._M_value.second,(monostate *)&res,&this->bitMapAllocator);
    }
  }
  return;
}

Assistant:

void DataFlowAnalysis::noteReference(const ValueSymbol& symbol, const Expression& lsp) {
    // This feels icky but we don't count a symbol as being referenced in the procedure
    // if it's only used inside an unreachable flow path. The alternative would just
    // frustrate users, but the reason it's icky is because whether a path is reachable
    // is based on whatever level of heuristics we're willing to implement rather than
    // some well defined set of rules in the LRM.
    auto& currState = getState();
    if (!currState.reachable)
        return;

    auto bounds = ValueDriver::getBounds(lsp, getEvalContext(), symbol.getType());
    if (!bounds) {
        // This probably cannot be hit given that we early out elsewhere for
        // invalid expressions.
        return;
    }

    if (isLValue) {
        auto [it, inserted] = symbolToSlot.try_emplace(&symbol, (uint32_t)lvalues.size());
        if (inserted) {
            lvalues.emplace_back(symbol);
            SLANG_ASSERT(lvalues.size() == symbolToSlot.size());
        }

        auto index = it->second;
        if (index >= currState.assigned.size())
            currState.assigned.resize(index + 1);

        currState.assigned[index].unionWith(*bounds, {}, bitMapAllocator);

        auto& lspMap = lvalues[index].assigned;
        for (auto lspIt = lspMap.find(*bounds); lspIt != lspMap.end();) {
            // If we find an existing entry that completely contains
            // the new bounds we can just keep that one and ignore the
            // new one. Otherwise we will insert a new entry.
            auto itBounds = lspIt.bounds();
            if (itBounds.first <= bounds->first && itBounds.second >= bounds->second)
                return;

            // If the new bounds completely contain the existing entry, we can remove it.
            if (bounds->first < itBounds.first && bounds->second > itBounds.second) {
                lspMap.erase(lspIt, lspMapAllocator);
                lspIt = lspMap.find(*bounds);
            }
            else {
                ++lspIt;
            }
        }
        lspMap.insert(*bounds, &lsp, lspMapAllocator);
    }
    else {
        rvalues[&symbol].unionWith(*bounds, {}, bitMapAllocator);
    }
}